

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.cxx
# Opt level: O3

bool cmSetTestsPropertiesCommand::SetOneTest
               (string *tname,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *propertyPairs,cmMakefile *mf,string *errors)

{
  cmTest *this;
  pointer pbVar1;
  pointer pbVar2;
  ulong uVar3;
  uint uVar4;
  
  this = cmMakefile::GetTest(mf,tname);
  if (this == (cmTest *)0x0) {
    std::__cxx11::string::_M_replace((ulong)errors,0,(char *)errors->_M_string_length,0x5003bc);
    std::__cxx11::string::_M_append((char *)errors,(ulong)(tname->_M_dataplus)._M_p);
  }
  else {
    pbVar1 = (propertyPairs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (propertyPairs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar2 != pbVar1) {
      uVar4 = 2;
      uVar3 = 0;
      do {
        if (pbVar1[uVar3]._M_string_length != 0) {
          cmTest::SetProperty(this,pbVar1 + uVar3,pbVar1[uVar4 - 1]._M_dataplus._M_p);
          pbVar1 = (propertyPairs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (propertyPairs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar3 = (ulong)uVar4;
        uVar4 = uVar4 + 2;
      } while (uVar3 < (ulong)((long)pbVar2 - (long)pbVar1 >> 5));
    }
  }
  return this != (cmTest *)0x0;
}

Assistant:

bool cmSetTestsPropertiesCommand
::SetOneTest(const std::string& tname,
             std::vector<std::string> &propertyPairs,
             cmMakefile *mf, std::string &errors)
{
  if(cmTest* test = mf->GetTest(tname))
    {
    // now loop through all the props and set them
    unsigned int k;
    for (k = 0; k < propertyPairs.size(); k = k + 2)
      {
      if (!propertyPairs[k].empty())
        {
        test->SetProperty(propertyPairs[k], propertyPairs[k+1].c_str());
        }
      }
    }
  else
    {
    errors = "Can not find test to add properties to: ";
    errors += tname;
    return false;
    }

  return true;
}